

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

void Ifn_NtkAddConstraints(Ifn_Ntk_t *p,sat_solver *pSat)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *vMemory;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  word uTruth;
  int pVars [11];
  word pTruth [4];
  ulong local_b0;
  int local_a8 [24];
  word local_48 [4];
  
  vMemory = (Vec_Int_t *)calloc(1,0x10);
  if (0x40 < (uint)p->nVars) {
    __assert_fail("nBits >= 0 && nBits <= 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                  ,0xc2,"word Abc_Tt6Mask(int)");
  }
  uVar5 = p->nParsVNum;
  if (-1 < (int)uVar5) {
    uVar2 = 2;
    if (2 < uVar5) {
      uVar2 = uVar5;
    }
    uVar7 = 3;
    if (2 < uVar5) {
      uVar7 = uVar2;
    }
    uVar2 = 4;
    if (uVar7 != 3) {
      uVar2 = uVar7;
    }
    uVar3 = 5;
    if (uVar2 != 4) {
      uVar3 = uVar2;
    }
    if (uVar3 - 5 < 2) {
      uVar9 = ~(0xffffffffffffffffU >> (-(char)p->nVars & 0x3fU));
      uVar13 = (uint)uVar9;
      uVar6 = 0;
      if (uVar5 != 0) {
        uVar6 = (uVar13 & 2) * 5;
      }
      if (1 < uVar5) {
        uVar6 = uVar13;
      }
      uVar12 = (ulong)((uVar6 & 0xe) << 4 | uVar6 & 0xe);
      if (2 < uVar5) {
        uVar12 = uVar9;
      }
      uVar6 = (uint)uVar12 & 0xfe;
      uVar9 = (ulong)(uVar6 << 8 | uVar6);
      if (uVar7 != 3) {
        uVar9 = uVar12;
      }
      uVar7 = (uint)uVar9 & 0xfffe;
      uVar12 = (ulong)(uVar7 << 0x10 | uVar7);
      if (uVar2 != 4) {
        uVar12 = uVar9;
      }
      local_b0 = CONCAT44((int)uVar12,(int)uVar12) & 0xfffffffefffffffe;
      if (uVar3 != 5) {
        local_b0 = uVar12;
      }
      if (uVar5 < 5) {
        if (local_b0 != 0) {
          iVar4 = Kit_TruthIsop((uint *)&local_b0,uVar5,vMemory,0);
          if (iVar4 != 0) {
            __assert_fail("RetValue == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                          ,0x427,"void Ifn_NtkAddConstraints(Ifn_Ntk_t *, sat_solver *)");
          }
          if (0 < p->nInps) {
            iVar4 = 0;
            do {
              iVar1 = p->nParsVNum;
              if (0 < (long)iVar1) {
                lVar10 = (long)iVar1 + -1;
                auVar14._8_4_ = (int)lVar10;
                auVar14._0_8_ = lVar10;
                auVar14._12_4_ = (int)((ulong)lVar10 >> 0x20);
                iVar8 = iVar1 * iVar4 + p->nParsVIni;
                auVar14 = auVar14 ^ _DAT_007ee2e0;
                lVar10 = 0;
                auVar15 = _DAT_007ee2d0;
                do {
                  auVar16 = auVar15 ^ _DAT_007ee2e0;
                  if ((bool)(~(auVar14._4_4_ < auVar16._4_4_ ||
                              auVar14._0_4_ < auVar16._0_4_ && auVar16._4_4_ == auVar14._4_4_) & 1))
                  {
                    *(int *)((long)local_a8 + lVar10) = iVar8;
                  }
                  if (auVar16._12_4_ <= auVar14._12_4_ &&
                      (auVar16._8_4_ <= auVar14._8_4_ || auVar16._12_4_ != auVar14._12_4_)) {
                    *(int *)((long)local_a8 + lVar10 + 4) = iVar8 + 1;
                  }
                  lVar11 = auVar15._8_8_;
                  auVar15._0_8_ = auVar15._0_8_ + 2;
                  auVar15._8_8_ = lVar11 + 2;
                  lVar10 = lVar10 + 8;
                  iVar8 = iVar8 + 2;
                } while ((ulong)(iVar1 + 1U >> 1) << 3 != lVar10);
              }
              Ifn_NtkAddConstrOne(pSat,vMemory,local_a8,iVar1);
              iVar4 = iVar4 + 1;
            } while (iVar4 < p->nInps);
          }
        }
        if (p->nConstr != 0) {
          uVar5 = (uint)(p->nVars == p->nInps);
          Ifn_TtComparisonConstr(local_48,p->nParsVNum,uVar5,uVar5);
          iVar4 = Kit_TruthIsop((uint *)local_48,p->nParsVNum * 2,vMemory,0);
          if (iVar4 != 0) {
            __assert_fail("RetValue == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                          ,0x439,"void Ifn_NtkAddConstraints(Ifn_Ntk_t *, sat_solver *)");
          }
          if (0 < p->nConstr) {
            lVar10 = 0;
            do {
              iVar4 = p->nParsVNum;
              if (0 < (long)iVar4) {
                uVar5 = p->pConstr[lVar10];
                iVar1 = p->nParsVIni;
                lVar11 = 0;
                do {
                  *(int *)(local_48 + lVar11 + -0xc) =
                       ((int)uVar5 >> 0x10) * iVar4 + iVar1 + (int)lVar11;
                  *(uint *)((long)local_48 + lVar11 * 8 + -0x5c) =
                       (uVar5 & 0xffff) * iVar4 + iVar1 + (int)lVar11;
                  lVar11 = lVar11 + 1;
                } while (iVar4 != lVar11);
              }
              Ifn_NtkAddConstrOne(pSat,vMemory,local_a8,iVar4 * 2);
              lVar10 = lVar10 + 1;
            } while (lVar10 < p->nConstr);
          }
        }
        if (vMemory->pArray != (int *)0x0) {
          free(vMemory->pArray);
        }
        free(vMemory);
        return;
      }
      __assert_fail("p->nParsVNum <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                    ,0x422,"void Ifn_NtkAddConstraints(Ifn_Ntk_t *, sat_solver *)");
    }
    __assert_fail("nVars == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                  ,0x31a,"word Abc_Tt6Stretch(word, int)");
  }
  __assert_fail("nVars >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                ,0x30d,"word Abc_Tt6Stretch(word, int)");
}

Assistant:

void Ifn_NtkAddConstraints( Ifn_Ntk_t * p, sat_solver * pSat )
{
    int fAddConstr = 1;
    Vec_Int_t * vCover = Vec_IntAlloc( 0 );
    word uTruth = Abc_Tt6Stretch( ~Abc_Tt6Mask(p->nVars), p->nParsVNum );
    assert( p->nParsVNum <= 4 );
    if ( uTruth )
    {
        int i, k, pVars[IFN_INS];
        int RetValue = Kit_TruthIsop( (unsigned *)&uTruth, p->nParsVNum, vCover, 0 );
        assert( RetValue == 0 );
//        Dau_DsdPrintFromTruth( &uTruth, p->nParsVNum );
        // add capacity constraints
        for ( i = 0; i < p->nInps; i++ )
        {
            for ( k = 0; k < p->nParsVNum; k++ )
                pVars[k] = p->nParsVIni + i * p->nParsVNum + k;
            Ifn_NtkAddConstrOne( pSat, vCover, pVars, p->nParsVNum );
        }
    }
    // ordering constraints
    if ( fAddConstr && p->nConstr )
    {
        word pTruth[4];
        int i, k, RetValue, pVars[2*IFN_INS];
        int fForceDiff = (p->nVars == p->nInps);
        Ifn_TtComparisonConstr( pTruth, p->nParsVNum, fForceDiff, fForceDiff );
        RetValue = Kit_TruthIsop( (unsigned *)pTruth, 2*p->nParsVNum, vCover, 0 );
        assert( RetValue == 0 );
//        Kit_TruthIsopPrintCover( vCover, 2*p->nParsVNum, 0 );
        for ( i = 0; i < p->nConstr; i++ )
        {
            int iVar1 = p->pConstr[i] >> 16;
            int iVar2 = p->pConstr[i] & 0xFFFF;
            for ( k = 0; k < p->nParsVNum; k++ )
            {
                pVars[2*k+0] = p->nParsVIni + iVar1 * p->nParsVNum + k;
                pVars[2*k+1] = p->nParsVIni + iVar2 * p->nParsVNum + k;
            }
            Ifn_NtkAddConstrOne( pSat, vCover, pVars, 2*p->nParsVNum );
//            printf( "added constraint with %d clauses for %d and %d\n", Vec_IntSize(vCover), iVar1, iVar2 );
        }
    }
    Vec_IntFree( vCover );
}